

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall cnn::AdagradTrainer::update(AdagradTrainer *this,real scale)

{
  real rVar1;
  float fVar2;
  Model *pMVar3;
  pointer ppPVar4;
  Parameters *this_00;
  pointer pSVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  LookupParameters *this_01;
  pointer pSVar10;
  pointer pTVar11;
  pointer pTVar12;
  long lVar13;
  bool bVar14;
  byte bVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  byte bVar22;
  Index size_1;
  _Hash_node_base *p_Var23;
  pointer ppLVar24;
  ulong uVar25;
  char *pcVar26;
  ulong uVar27;
  Index index;
  long lVar28;
  Index index_7;
  uint uVar29;
  Index index_3;
  uint uVar30;
  Index size;
  Index index_2;
  uint uVar31;
  Index index_5;
  ulong uVar32;
  ulong uVar33;
  Index index_1;
  ulong uVar34;
  Index index_4;
  pointer ppPVar35;
  ulong uVar36;
  ulong uVar37;
  ushort uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  int iVar69;
  int iVar70;
  int iVar71;
  undefined1 auVar72 [16];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM17 [64];
  ulong local_110;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_f8;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> local_d8;
  undefined1 local_b8 [64];
  undefined1 local_78 [64];
  
  if (this->shadow_params_allocated == false) {
    AllocateShadowParameters
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_f8,
               (this->super_Trainer).model);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->vp).
                  super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)local_f8.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_f8.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->vp).super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_f8.
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_d8);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)&local_f8);
    AllocateShadowLookupParameters(&local_f8,(this->super_Trainer).model);
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_d8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->vlp).
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_f8.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_f8.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->vlp).
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_f8.
         super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_d8);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (&local_f8);
    this->shadow_params_allocated = true;
  }
  local_b8._0_4_ = Trainer::clip_gradients(&this->super_Trainer);
  pMVar3 = (this->super_Trainer).model;
  ppPVar35 = (pMVar3->params).
             super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppPVar4 = (pMVar3->params).
            super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppPVar35 != ppPVar4) {
    fVar17 = (float)local_b8._0_4_ * scale;
    local_78 = vbroadcastss_avx512f(ZEXT416((uint)(fVar17 * fVar17)));
    uVar37 = 0;
    auVar42 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
    auVar43 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
    auVar44 = vpternlogd_avx512f(in_ZMM14,in_ZMM14,in_ZMM14,0xff);
    auVar45 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
    auVar46 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
    auVar47 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    in_ZMM17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_00 = *ppPVar35;
      uVar36 = (ulong)(this_00->values).d.nd;
      iVar70 = 1;
      iVar69 = 1;
      if (uVar36 != 0) {
        auVar49 = vpbroadcastq_avx512f();
        uVar27 = 0;
        auVar50 = vmovdqa64_avx512f(auVar47);
        do {
          auVar51 = vmovdqa64_avx512f(auVar50);
          auVar50 = vpbroadcastq_avx512f();
          auVar52 = vporq_avx512f(auVar50,auVar48);
          auVar50 = vporq_avx512f(auVar50,in_ZMM17);
          uVar19 = vpcmpuq_avx512f(auVar50,auVar49,2);
          bVar15 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar52,auVar49,2);
          bVar22 = (byte)uVar19;
          uVar38 = CONCAT11(bVar22,bVar15);
          auVar50 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar27));
          auVar52._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar50._4_4_;
          auVar52._0_4_ = (uint)(bVar15 & 1) * auVar50._0_4_;
          auVar52._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar50._8_4_;
          auVar52._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar50._12_4_;
          auVar52._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar50._16_4_;
          auVar52._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar50._20_4_;
          auVar52._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar50._24_4_;
          auVar52._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar50._28_4_;
          auVar52._32_4_ = (uint)(bVar22 & 1) * auVar50._32_4_;
          auVar52._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar50._36_4_;
          auVar52._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar50._40_4_;
          auVar52._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar50._44_4_;
          auVar52._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar50._48_4_;
          auVar52._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar50._52_4_;
          auVar52._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar50._56_4_;
          auVar52._60_4_ = (uint)(bVar22 >> 7) * auVar50._60_4_;
          auVar50 = vpmulld_avx512f(auVar52,auVar51);
          uVar27 = uVar27 + 0x10;
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar27);
        auVar49 = vmovdqa32_avx512f(auVar50);
        auVar50._0_4_ =
             (uint)(bVar15 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar51._0_4_;
        bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar50._4_4_ = (uint)bVar14 * auVar49._4_4_ | (uint)!bVar14 * auVar51._4_4_;
        bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar50._8_4_ = (uint)bVar14 * auVar49._8_4_ | (uint)!bVar14 * auVar51._8_4_;
        bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar50._12_4_ = (uint)bVar14 * auVar49._12_4_ | (uint)!bVar14 * auVar51._12_4_;
        bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar50._16_4_ = (uint)bVar14 * auVar49._16_4_ | (uint)!bVar14 * auVar51._16_4_;
        bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar50._20_4_ = (uint)bVar14 * auVar49._20_4_ | (uint)!bVar14 * auVar51._20_4_;
        bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar50._24_4_ = (uint)bVar14 * auVar49._24_4_ | (uint)!bVar14 * auVar51._24_4_;
        bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
        auVar50._28_4_ = (uint)bVar14 * auVar49._28_4_ | (uint)!bVar14 * auVar51._28_4_;
        auVar50._32_4_ =
             (uint)(bVar22 & 1) * auVar49._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar51._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar50._36_4_ = (uint)bVar14 * auVar49._36_4_ | (uint)!bVar14 * auVar51._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar50._40_4_ = (uint)bVar14 * auVar49._40_4_ | (uint)!bVar14 * auVar51._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar50._44_4_ = (uint)bVar14 * auVar49._44_4_ | (uint)!bVar14 * auVar51._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar50._48_4_ = (uint)bVar14 * auVar49._48_4_ | (uint)!bVar14 * auVar51._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar50._52_4_ = (uint)bVar14 * auVar49._52_4_ | (uint)!bVar14 * auVar51._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar50._56_4_ = (uint)bVar14 * auVar49._56_4_ | (uint)!bVar14 * auVar51._56_4_;
        auVar50._60_4_ =
             (uint)(bVar22 >> 7) * auVar49._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar51._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar50,1);
        auVar49 = vpmulld_avx512f(auVar50,ZEXT3264(auVar41));
        auVar39 = vpmulld_avx(auVar49._0_16_,auVar49._16_16_);
        auVar40 = vpshufd_avx(auVar39,0xee);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        auVar40 = vpshufd_avx(auVar39,0x55);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        iVar69 = auVar39._0_4_;
      }
      uVar36 = (ulong)(this_00->g).d.nd;
      if (uVar36 != 0) {
        auVar49 = vpbroadcastq_avx512f();
        uVar27 = 0;
        auVar50 = vmovdqa64_avx512f(auVar47);
        do {
          auVar51 = vmovdqa64_avx512f(auVar50);
          auVar50 = vpbroadcastq_avx512f();
          auVar52 = vporq_avx512f(auVar50,auVar48);
          auVar50 = vporq_avx512f(auVar50,in_ZMM17);
          uVar19 = vpcmpuq_avx512f(auVar50,auVar49,2);
          bVar15 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar52,auVar49,2);
          bVar22 = (byte)uVar19;
          uVar38 = CONCAT11(bVar22,bVar15);
          auVar50 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->g).d.d + uVar27));
          auVar54._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar50._4_4_;
          auVar54._0_4_ = (uint)(bVar15 & 1) * auVar50._0_4_;
          auVar54._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar50._8_4_;
          auVar54._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar50._12_4_;
          auVar54._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar50._16_4_;
          auVar54._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar50._20_4_;
          auVar54._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar50._24_4_;
          auVar54._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar50._28_4_;
          auVar54._32_4_ = (uint)(bVar22 & 1) * auVar50._32_4_;
          auVar54._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar50._36_4_;
          auVar54._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar50._40_4_;
          auVar54._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar50._44_4_;
          auVar54._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar50._48_4_;
          auVar54._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar50._52_4_;
          auVar54._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar50._56_4_;
          auVar54._60_4_ = (uint)(bVar22 >> 7) * auVar50._60_4_;
          auVar50 = vpmulld_avx512f(auVar54,auVar51);
          uVar27 = uVar27 + 0x10;
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar27);
        auVar50 = vmovdqa32_avx512f(auVar50);
        auVar49._0_4_ =
             (uint)(bVar15 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar51._0_4_;
        bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar49._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar51._4_4_;
        bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar49._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar51._8_4_;
        bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar49._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar51._12_4_;
        bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar49._16_4_ = (uint)bVar14 * auVar50._16_4_ | (uint)!bVar14 * auVar51._16_4_;
        bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar49._20_4_ = (uint)bVar14 * auVar50._20_4_ | (uint)!bVar14 * auVar51._20_4_;
        bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar49._24_4_ = (uint)bVar14 * auVar50._24_4_ | (uint)!bVar14 * auVar51._24_4_;
        bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
        auVar49._28_4_ = (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * auVar51._28_4_;
        auVar49._32_4_ =
             (uint)(bVar22 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar51._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar49._36_4_ = (uint)bVar14 * auVar50._36_4_ | (uint)!bVar14 * auVar51._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar49._40_4_ = (uint)bVar14 * auVar50._40_4_ | (uint)!bVar14 * auVar51._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar49._44_4_ = (uint)bVar14 * auVar50._44_4_ | (uint)!bVar14 * auVar51._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar49._48_4_ = (uint)bVar14 * auVar50._48_4_ | (uint)!bVar14 * auVar51._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar49._52_4_ = (uint)bVar14 * auVar50._52_4_ | (uint)!bVar14 * auVar51._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar49._56_4_ = (uint)bVar14 * auVar50._56_4_ | (uint)!bVar14 * auVar51._56_4_;
        auVar49._60_4_ =
             (uint)(bVar22 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar51._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar49,1);
        auVar49 = vpmulld_avx512f(auVar49,ZEXT3264(auVar41));
        auVar39 = vpmulld_avx(auVar49._0_16_,auVar49._16_16_);
        auVar40 = vpshufd_avx(auVar39,0xee);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        auVar40 = vpshufd_avx(auVar39,0x55);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        iVar70 = auVar39._0_4_;
      }
      pSVar5 = (this->vp).
               super__Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar36 = (ulong)pSVar5[uVar37].h.d.nd;
      if (uVar36 == 0) {
        iVar71 = 1;
      }
      else {
        auVar49 = vpbroadcastq_avx512f();
        uVar27 = 0;
        auVar50 = vmovdqa64_avx512f(auVar47);
        do {
          auVar51 = vmovdqa64_avx512f(auVar50);
          auVar50 = vpbroadcastq_avx512f();
          auVar52 = vporq_avx512f(auVar50,auVar48);
          auVar50 = vporq_avx512f(auVar50,in_ZMM17);
          uVar19 = vpcmpuq_avx512f(auVar50,auVar49,2);
          bVar15 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar52,auVar49,2);
          bVar22 = (byte)uVar19;
          uVar38 = CONCAT11(bVar22,bVar15);
          auVar50 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar5[uVar37].h.d.d + uVar27 * 4));
          auVar65._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar50._4_4_;
          auVar65._0_4_ = (uint)(bVar15 & 1) * auVar50._0_4_;
          auVar65._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar50._8_4_;
          auVar65._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar50._12_4_;
          auVar65._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar50._16_4_;
          auVar65._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar50._20_4_;
          auVar65._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar50._24_4_;
          auVar65._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar50._28_4_;
          auVar65._32_4_ = (uint)(bVar22 & 1) * auVar50._32_4_;
          auVar65._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar50._36_4_;
          auVar65._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar50._40_4_;
          auVar65._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar50._44_4_;
          auVar65._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar50._48_4_;
          auVar65._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar50._52_4_;
          auVar65._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar50._56_4_;
          auVar65._60_4_ = (uint)(bVar22 >> 7) * auVar50._60_4_;
          auVar50 = vpmulld_avx512f(auVar65,auVar51);
          uVar27 = uVar27 + 0x10;
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar27);
        auVar49 = vmovdqa32_avx512f(auVar50);
        auVar66._0_4_ =
             (uint)(bVar15 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar51._0_4_;
        bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar14 * auVar49._4_4_ | (uint)!bVar14 * auVar51._4_4_;
        bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar14 * auVar49._8_4_ | (uint)!bVar14 * auVar51._8_4_;
        bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar14 * auVar49._12_4_ | (uint)!bVar14 * auVar51._12_4_;
        bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar66._16_4_ = (uint)bVar14 * auVar49._16_4_ | (uint)!bVar14 * auVar51._16_4_;
        bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar66._20_4_ = (uint)bVar14 * auVar49._20_4_ | (uint)!bVar14 * auVar51._20_4_;
        bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar66._24_4_ = (uint)bVar14 * auVar49._24_4_ | (uint)!bVar14 * auVar51._24_4_;
        bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
        auVar66._28_4_ = (uint)bVar14 * auVar49._28_4_ | (uint)!bVar14 * auVar51._28_4_;
        auVar66._32_4_ =
             (uint)(bVar22 & 1) * auVar49._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar51._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar66._36_4_ = (uint)bVar14 * auVar49._36_4_ | (uint)!bVar14 * auVar51._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar66._40_4_ = (uint)bVar14 * auVar49._40_4_ | (uint)!bVar14 * auVar51._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar66._44_4_ = (uint)bVar14 * auVar49._44_4_ | (uint)!bVar14 * auVar51._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar66._48_4_ = (uint)bVar14 * auVar49._48_4_ | (uint)!bVar14 * auVar51._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar66._52_4_ = (uint)bVar14 * auVar49._52_4_ | (uint)!bVar14 * auVar51._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar66._56_4_ = (uint)bVar14 * auVar49._56_4_ | (uint)!bVar14 * auVar51._56_4_;
        auVar66._60_4_ =
             (uint)(bVar22 >> 7) * auVar49._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar51._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar66,1);
        auVar49 = vpmulld_avx512f(auVar66,ZEXT3264(auVar41));
        auVar39 = vpmulld_avx(auVar49._0_16_,auVar49._16_16_);
        auVar40 = vpshufd_avx(auVar39,0xee);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        auVar40 = vpshufd_avx(auVar39,0x55);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        iVar71 = auVar39._0_4_;
      }
      uVar29 = iVar70 * (this_00->g).d.bd;
      uVar30 = iVar71 * pSVar5[uVar37].h.d.bd;
      uVar36 = (ulong)uVar30;
      if (uVar30 != uVar29) goto LAB_0022b55b;
      pfVar6 = pSVar5[uVar37].h.v;
      uVar27 = uVar36;
      if ((((ulong)pfVar6 & 3) == 0) &&
         (uVar27 = (ulong)(-((uint)((ulong)pfVar6 >> 2) & 0x3fffffff) & 0xf), uVar36 <= uVar27)) {
        uVar27 = uVar36;
      }
      pfVar7 = (this_00->values).v;
      uVar30 = iVar69 * (this_00->values).d.bd;
      rVar1 = (this->super_Trainer).lambda;
      pfVar8 = (this_00->g).v;
      uVar32 = uVar36 - uVar27;
      uVar34 = uVar32 + 0xf;
      if (-1 < (long)uVar32) {
        uVar34 = uVar32;
      }
      if (uVar27 != 0) {
        uVar33 = 0;
        do {
          auVar39 = vfmadd213ss_fma(ZEXT416((uint)(fVar17 * pfVar8[uVar33])),
                                    ZEXT416((uint)(fVar17 * pfVar8[uVar33])),
                                    ZEXT416((uint)pfVar6[uVar33]));
          pfVar6[uVar33] = auVar39._0_4_;
          uVar33 = uVar33 + 1;
        } while (uVar27 != uVar33);
      }
      uVar34 = (uVar34 & 0xfffffffffffffff0) + uVar27;
      if (0xf < (long)uVar32) {
        do {
          auVar49 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar8 + uVar27),
                                   *(undefined1 (*) [64])(pfVar8 + uVar27));
          auVar49 = vfmadd213ps_avx512f(auVar49,local_78,*(undefined1 (*) [64])(pfVar6 + uVar27));
          *(undefined1 (*) [64])(pfVar6 + uVar27) = auVar49;
          uVar27 = uVar27 + 0x10;
        } while ((long)uVar27 < (long)uVar34);
      }
      if ((long)uVar34 < (long)uVar36) {
        do {
          auVar39 = vfmadd213ss_fma(ZEXT416((uint)(fVar17 * pfVar8[uVar34])),
                                    ZEXT416((uint)(fVar17 * pfVar8[uVar34])),
                                    ZEXT416((uint)pfVar6[uVar34]));
          pfVar6[uVar34] = auVar39._0_4_;
          uVar34 = uVar34 + 1;
        } while (uVar36 != uVar34);
      }
      pfVar6 = pSVar5[uVar37].h.v;
      uVar36 = (ulong)pSVar5[uVar37].h.d.nd;
      if (uVar36 == 0) {
        iVar69 = 1;
      }
      else {
        auVar49 = vpbroadcastq_avx512f();
        uVar27 = 0;
        auVar50 = vmovdqa64_avx512f(auVar47);
        do {
          auVar51 = vmovdqa64_avx512f(auVar50);
          auVar50 = vpbroadcastq_avx512f();
          auVar52 = vporq_avx512f(auVar50,auVar48);
          auVar50 = vporq_avx512f(auVar50,in_ZMM17);
          uVar19 = vpcmpuq_avx512f(auVar50,auVar49,2);
          bVar15 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar52,auVar49,2);
          bVar22 = (byte)uVar19;
          uVar38 = CONCAT11(bVar22,bVar15);
          auVar50 = vmovdqu32_avx512f(*(undefined1 (*) [64])
                                       ((long)pSVar5[uVar37].h.d.d + uVar27 * 4));
          auVar67._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar50._4_4_;
          auVar67._0_4_ = (uint)(bVar15 & 1) * auVar50._0_4_;
          auVar67._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar50._8_4_;
          auVar67._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar50._12_4_;
          auVar67._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar50._16_4_;
          auVar67._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar50._20_4_;
          auVar67._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar50._24_4_;
          auVar67._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar50._28_4_;
          auVar67._32_4_ = (uint)(bVar22 & 1) * auVar50._32_4_;
          auVar67._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar50._36_4_;
          auVar67._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar50._40_4_;
          auVar67._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar50._44_4_;
          auVar67._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar50._48_4_;
          auVar67._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar50._52_4_;
          auVar67._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar50._56_4_;
          auVar67._60_4_ = (uint)(bVar22 >> 7) * auVar50._60_4_;
          auVar50 = vpmulld_avx512f(auVar67,auVar51);
          uVar27 = uVar27 + 0x10;
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar27);
        auVar49 = vmovdqa32_avx512f(auVar50);
        auVar53._0_4_ =
             (uint)(bVar15 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar51._0_4_;
        bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar53._4_4_ = (uint)bVar14 * auVar49._4_4_ | (uint)!bVar14 * auVar51._4_4_;
        bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar53._8_4_ = (uint)bVar14 * auVar49._8_4_ | (uint)!bVar14 * auVar51._8_4_;
        bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar53._12_4_ = (uint)bVar14 * auVar49._12_4_ | (uint)!bVar14 * auVar51._12_4_;
        bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar53._16_4_ = (uint)bVar14 * auVar49._16_4_ | (uint)!bVar14 * auVar51._16_4_;
        bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar53._20_4_ = (uint)bVar14 * auVar49._20_4_ | (uint)!bVar14 * auVar51._20_4_;
        bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar53._24_4_ = (uint)bVar14 * auVar49._24_4_ | (uint)!bVar14 * auVar51._24_4_;
        bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
        auVar53._28_4_ = (uint)bVar14 * auVar49._28_4_ | (uint)!bVar14 * auVar51._28_4_;
        auVar53._32_4_ =
             (uint)(bVar22 & 1) * auVar49._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar51._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar53._36_4_ = (uint)bVar14 * auVar49._36_4_ | (uint)!bVar14 * auVar51._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar53._40_4_ = (uint)bVar14 * auVar49._40_4_ | (uint)!bVar14 * auVar51._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar53._44_4_ = (uint)bVar14 * auVar49._44_4_ | (uint)!bVar14 * auVar51._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar53._48_4_ = (uint)bVar14 * auVar49._48_4_ | (uint)!bVar14 * auVar51._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar53._52_4_ = (uint)bVar14 * auVar49._52_4_ | (uint)!bVar14 * auVar51._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar53._56_4_ = (uint)bVar14 * auVar49._56_4_ | (uint)!bVar14 * auVar51._56_4_;
        auVar53._60_4_ =
             (uint)(bVar22 >> 7) * auVar49._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar51._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar53,1);
        auVar49 = vpmulld_avx512f(auVar53,ZEXT3264(auVar41));
        auVar39 = vpmulld_avx(auVar49._0_16_,auVar49._16_16_);
        auVar40 = vpshufd_avx(auVar39,0xee);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        auVar40 = vpshufd_avx(auVar39,0x55);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        iVar69 = auVar39._0_4_;
      }
      uVar31 = iVar69 * pSVar5[uVar37].h.d.bd;
      if (uVar29 != uVar31) goto LAB_0022b544;
      if (uVar31 != uVar30) goto LAB_0022b57d;
      uVar36 = (ulong)(this_00->values).d.nd;
      if (uVar36 == 0) {
        iVar69 = 1;
      }
      else {
        auVar49 = vpbroadcastq_avx512f();
        uVar27 = 0;
        auVar47 = vmovdqa64_avx512f(auVar47);
        do {
          auVar50 = vmovdqa64_avx512f(auVar47);
          auVar47 = vpbroadcastq_avx512f();
          auVar51 = vporq_avx512f(auVar47,auVar48);
          auVar47 = vporq_avx512f(auVar47,in_ZMM17);
          uVar19 = vpcmpuq_avx512f(auVar47,auVar49,2);
          bVar15 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar51,auVar49,2);
          bVar22 = (byte)uVar19;
          uVar38 = CONCAT11(bVar22,bVar15);
          auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this_00->values).d.d + uVar27));
          auVar47._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar51._4_4_;
          auVar47._0_4_ = (uint)(bVar15 & 1) * auVar51._0_4_;
          auVar47._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar51._8_4_;
          auVar47._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar51._12_4_;
          auVar47._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar51._16_4_;
          auVar47._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar51._20_4_;
          auVar47._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar51._24_4_;
          auVar47._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar51._28_4_;
          auVar47._32_4_ = (uint)(bVar22 & 1) * auVar51._32_4_;
          auVar47._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar51._36_4_;
          auVar47._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar51._40_4_;
          auVar47._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar51._44_4_;
          auVar47._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar51._48_4_;
          auVar47._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar51._52_4_;
          auVar47._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar51._56_4_;
          auVar47._60_4_ = (uint)(bVar22 >> 7) * auVar51._60_4_;
          auVar47 = vpmulld_avx512f(auVar47,auVar50);
          uVar27 = uVar27 + 0x10;
        } while ((uVar36 + 0xf & 0x1fffffff0) != uVar27);
        auVar47 = vmovdqa32_avx512f(auVar47);
        auVar48._0_4_ =
             (uint)(bVar15 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar50._0_4_;
        bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar48._4_4_ = (uint)bVar14 * auVar47._4_4_ | (uint)!bVar14 * auVar50._4_4_;
        bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar48._8_4_ = (uint)bVar14 * auVar47._8_4_ | (uint)!bVar14 * auVar50._8_4_;
        bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
        auVar48._12_4_ = (uint)bVar14 * auVar47._12_4_ | (uint)!bVar14 * auVar50._12_4_;
        bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
        auVar48._16_4_ = (uint)bVar14 * auVar47._16_4_ | (uint)!bVar14 * auVar50._16_4_;
        bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
        auVar48._20_4_ = (uint)bVar14 * auVar47._20_4_ | (uint)!bVar14 * auVar50._20_4_;
        bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
        auVar48._24_4_ = (uint)bVar14 * auVar47._24_4_ | (uint)!bVar14 * auVar50._24_4_;
        bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
        auVar48._28_4_ = (uint)bVar14 * auVar47._28_4_ | (uint)!bVar14 * auVar50._28_4_;
        auVar48._32_4_ =
             (uint)(bVar22 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar50._32_4_;
        bVar14 = (bool)(bVar22 >> 1 & 1);
        auVar48._36_4_ = (uint)bVar14 * auVar47._36_4_ | (uint)!bVar14 * auVar50._36_4_;
        bVar14 = (bool)(bVar22 >> 2 & 1);
        auVar48._40_4_ = (uint)bVar14 * auVar47._40_4_ | (uint)!bVar14 * auVar50._40_4_;
        bVar14 = (bool)(bVar22 >> 3 & 1);
        auVar48._44_4_ = (uint)bVar14 * auVar47._44_4_ | (uint)!bVar14 * auVar50._44_4_;
        bVar14 = (bool)(bVar22 >> 4 & 1);
        auVar48._48_4_ = (uint)bVar14 * auVar47._48_4_ | (uint)!bVar14 * auVar50._48_4_;
        bVar14 = (bool)(bVar22 >> 5 & 1);
        auVar48._52_4_ = (uint)bVar14 * auVar47._52_4_ | (uint)!bVar14 * auVar50._52_4_;
        bVar14 = (bool)(bVar22 >> 6 & 1);
        auVar48._56_4_ = (uint)bVar14 * auVar47._56_4_ | (uint)!bVar14 * auVar50._56_4_;
        auVar48._60_4_ =
             (uint)(bVar22 >> 7) * auVar47._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar50._60_4_;
        auVar41 = vextracti64x4_avx512f(auVar48,1);
        auVar47 = vpmulld_avx512f(auVar48,ZEXT3264(auVar41));
        auVar39 = vpmulld_avx(auVar47._0_16_,auVar47._16_16_);
        auVar40 = vpshufd_avx(auVar39,0xee);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        auVar40 = vpshufd_avx(auVar39,0x55);
        auVar39 = vpmulld_avx(auVar39,auVar40);
        iVar69 = auVar39._0_4_;
      }
      uVar29 = iVar69 * (this_00->values).d.bd;
      uVar36 = (ulong)uVar29;
      if (uVar29 != uVar30) goto LAB_0022b52d;
      pfVar9 = (this_00->values).v;
      uVar27 = uVar36;
      if ((((ulong)pfVar9 & 3) == 0) &&
         (uVar27 = (ulong)(-((uint)((ulong)pfVar9 >> 2) & 0x3fffffff) & 0xf), uVar36 <= uVar27)) {
        uVar27 = uVar36;
      }
      auVar39._8_4_ = 0x80000000;
      auVar39._0_8_ = 0x8000000080000000;
      auVar39._12_4_ = 0x80000000;
      auVar39 = vxorps_avx512vl(ZEXT416((uint)(this->super_Trainer).eta),auVar39);
      fVar2 = this->epsilon;
      uVar32 = uVar36 - uVar27;
      uVar34 = uVar32 + 0xf;
      if (-1 < (long)uVar32) {
        uVar34 = uVar32;
      }
      fVar18 = fVar17 * auVar39._0_4_;
      auVar39 = ZEXT416((uint)rVar1);
      if (uVar27 != 0) {
        uVar33 = 0;
        do {
          fVar16 = fVar2 + pfVar6[uVar33];
          auVar40 = vrsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
          auVar72 = vfmadd213ss_fma(ZEXT416((uint)(fVar16 * auVar40._0_4_)),auVar40,
                                    SUB6416(ZEXT464(0xc0400000),0));
          auVar21 = vfnmadd213ss_fma(ZEXT416((uint)pfVar7[uVar33]),auVar39,
                                     ZEXT416((uint)pfVar9[uVar33]));
          auVar40 = vfmadd231ss_fma(auVar21,ZEXT416((uint)(auVar40._0_4_ * -0.5 * auVar72._0_4_)),
                                    ZEXT416((uint)(fVar18 * pfVar8[uVar33])));
          pfVar9[uVar33] = auVar40._0_4_;
          uVar33 = uVar33 + 1;
        } while (uVar27 != uVar33);
      }
      uVar34 = (uVar34 & 0xfffffffffffffff0) + uVar27;
      if (0xf < (long)uVar32) {
        auVar47 = vbroadcastss_avx512f(ZEXT416((uint)fVar2));
        auVar48 = vbroadcastss_avx512f(ZEXT416((uint)fVar18));
        auVar40._8_4_ = 0x80000000;
        auVar40._0_8_ = 0x8000000080000000;
        auVar40._12_4_ = 0x80000000;
        auVar40 = vxorps_avx512vl(auVar39,auVar40);
        auVar49 = vbroadcastss_avx512f(auVar40);
        do {
          auVar50 = vaddps_avx512f(auVar47,*(undefined1 (*) [64])(pfVar6 + uVar27));
          auVar51 = vmulps_avx512f(auVar50,auVar42);
          uVar20 = vptestnmd_avx512f(auVar50,auVar43);
          auVar52 = vpaddd_avx512f(auVar50,auVar44);
          uVar19 = vpcmpud_avx512f(auVar52,auVar45,1);
          auVar52 = vrsqrt14ps_avx512f(auVar50);
          auVar54 = vmulps_avx512f(auVar52,auVar52);
          auVar51 = vfmadd213ps_avx512f(auVar54,auVar51,auVar46);
          auVar50 = vmulps_avx512f(auVar50,auVar52);
          uVar38 = ~((ushort)uVar20 | (ushort)uVar19);
          auVar50 = vmulps_avx512f(auVar50,auVar51);
          auVar51._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar50._4_4_;
          auVar51._0_4_ = (uint)((byte)uVar38 & 1) * auVar50._0_4_;
          auVar51._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar50._8_4_;
          auVar51._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar50._12_4_;
          auVar51._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar50._16_4_;
          auVar51._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar50._20_4_;
          auVar51._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar50._24_4_;
          auVar51._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar50._28_4_;
          bVar15 = (byte)(uVar38 >> 8);
          auVar51._32_4_ = (uint)(bVar15 & 1) * auVar50._32_4_;
          auVar51._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar50._36_4_;
          auVar51._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar50._40_4_;
          auVar51._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar50._44_4_;
          auVar51._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar50._48_4_;
          auVar51._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar50._52_4_;
          auVar51._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar50._56_4_;
          auVar51._60_4_ = (uint)(bVar15 >> 7) * auVar50._60_4_;
          auVar50 = vrcp14ps_avx512f(auVar51);
          auVar52 = vmulps_avx512f(auVar48,*(undefined1 (*) [64])(pfVar8 + uVar27));
          auVar54 = vmulps_avx512f(auVar52,auVar50);
          auVar51 = vfmsub213ps_avx512f(auVar51,auVar54,auVar52);
          auVar50 = vfnmadd213ps_avx512f(auVar51,auVar50,auVar54);
          auVar51 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar7 + uVar27),auVar49,
                                        *(undefined1 (*) [64])(pfVar9 + uVar27));
          auVar50 = vaddps_avx512f(auVar51,auVar50);
          *(undefined1 (*) [64])(pfVar9 + uVar27) = auVar50;
          uVar27 = uVar27 + 0x10;
        } while ((long)uVar27 < (long)uVar34);
      }
      if ((long)uVar34 < (long)uVar36) {
        do {
          fVar16 = fVar2 + pfVar6[uVar34];
          auVar40 = vrsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
          auVar72 = vfmadd213ss_fma(ZEXT416((uint)(fVar16 * auVar40._0_4_)),auVar40,
                                    SUB6416(ZEXT464(0xc0400000),0));
          auVar21 = vfnmadd213ss_fma(ZEXT416((uint)pfVar7[uVar34]),auVar39,
                                     ZEXT416((uint)pfVar9[uVar34]));
          auVar40 = vfmadd231ss_fma(auVar21,ZEXT416((uint)(auVar40._0_4_ * -0.5 * auVar72._0_4_)),
                                    ZEXT416((uint)(fVar18 * pfVar8[uVar34])));
          pfVar9[uVar34] = auVar40._0_4_;
          uVar34 = uVar34 + 1;
        } while (uVar36 != uVar34);
      }
      uVar37 = (ulong)((int)uVar37 + 1);
      auVar44 = ZEXT1664(auVar44._0_16_);
      Parameters::clear(this_00);
      ppPVar35 = ppPVar35 + 1;
      auVar42 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar43 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      auVar44 = vpternlogd_avx512f(auVar44,auVar44,auVar44,0xff);
      auVar45 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
      auVar46 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
      auVar47 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      in_ZMM17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (ppPVar35 != ppPVar4);
  }
  pMVar3 = (this->super_Trainer).model;
  ppLVar24 = (pMVar3->lookup_params).
             super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_78._0_8_ =
       (pMVar3->lookup_params).
       super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (ppLVar24 != (pointer)local_78._0_8_) {
    fVar17 = (float)local_b8._0_4_ * scale;
    local_b8 = vbroadcastss_avx512f(ZEXT416((uint)(fVar17 * fVar17)));
    local_110 = 0;
    auVar42 = vpbroadcastd_avx512f(ZEXT416(0xbf000000));
    auVar43 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
    auVar44 = vpternlogd_avx512f(in_ZMM17,in_ZMM17,in_ZMM17,0xff);
    auVar45 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
    auVar46 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
    auVar47 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      this_01 = *ppLVar24;
      p_Var23 = (this_01->non_zero_grads)._M_h._M_before_begin._M_nxt;
      if (p_Var23 != (_Hash_node_base *)0x0) {
        pSVar10 = (this->vlp).
                  super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar37 = (ulong)*(uint *)&p_Var23[1]._M_nxt;
          pTVar11 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)pTVar11[uVar37].d.nd;
          iVar70 = 1;
          iVar69 = 1;
          if (uVar36 != 0) {
            auVar50 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar51 = vmovdqa64_avx512f(auVar47);
            do {
              auVar52 = vmovdqa64_avx512f(auVar51);
              auVar51 = vpbroadcastq_avx512f();
              auVar54 = vporq_avx512f(auVar51,auVar48);
              auVar51 = vporq_avx512f(auVar51,auVar49);
              uVar19 = vpcmpuq_avx512f(auVar51,auVar50,2);
              bVar15 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar54,auVar50,2);
              bVar22 = (byte)uVar19;
              uVar38 = CONCAT11(bVar22,bVar15);
              auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar11[uVar37].d.d + uVar27));
              auVar55._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar51._4_4_;
              auVar55._0_4_ = (uint)(bVar15 & 1) * auVar51._0_4_;
              auVar55._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar51._8_4_;
              auVar55._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar51._12_4_;
              auVar55._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar51._16_4_;
              auVar55._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar51._20_4_;
              auVar55._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar51._24_4_;
              auVar55._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar51._28_4_;
              auVar55._32_4_ = (uint)(bVar22 & 1) * auVar51._32_4_;
              auVar55._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar51._36_4_;
              auVar55._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar51._40_4_;
              auVar55._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar51._44_4_;
              auVar55._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar51._48_4_;
              auVar55._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar51._52_4_;
              auVar55._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar51._56_4_;
              auVar55._60_4_ = (uint)(bVar22 >> 7) * auVar51._60_4_;
              auVar51 = vpmulld_avx512f(auVar55,auVar52);
              uVar27 = uVar27 + 0x10;
            } while ((uVar36 + 0xf & 0x1fffffff0) != uVar27);
            auVar50 = vmovdqa32_avx512f(auVar51);
            auVar56._0_4_ =
                 (uint)(bVar15 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar52._0_4_;
            bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar56._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar52._4_4_;
            bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar56._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar52._8_4_;
            bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
            auVar56._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar52._12_4_;
            bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
            auVar56._16_4_ = (uint)bVar14 * auVar50._16_4_ | (uint)!bVar14 * auVar52._16_4_;
            bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
            auVar56._20_4_ = (uint)bVar14 * auVar50._20_4_ | (uint)!bVar14 * auVar52._20_4_;
            bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
            auVar56._24_4_ = (uint)bVar14 * auVar50._24_4_ | (uint)!bVar14 * auVar52._24_4_;
            bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
            auVar56._28_4_ = (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * auVar52._28_4_;
            auVar56._32_4_ =
                 (uint)(bVar22 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar52._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar56._36_4_ = (uint)bVar14 * auVar50._36_4_ | (uint)!bVar14 * auVar52._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar56._40_4_ = (uint)bVar14 * auVar50._40_4_ | (uint)!bVar14 * auVar52._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar56._44_4_ = (uint)bVar14 * auVar50._44_4_ | (uint)!bVar14 * auVar52._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar56._48_4_ = (uint)bVar14 * auVar50._48_4_ | (uint)!bVar14 * auVar52._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar56._52_4_ = (uint)bVar14 * auVar50._52_4_ | (uint)!bVar14 * auVar52._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar56._56_4_ = (uint)bVar14 * auVar50._56_4_ | (uint)!bVar14 * auVar52._56_4_;
            auVar56._60_4_ =
                 (uint)(bVar22 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar52._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar56,1);
            auVar50 = vpmulld_avx512f(auVar56,ZEXT3264(auVar41));
            auVar39 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
            auVar40 = vpshufd_avx(auVar39,0xee);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            auVar40 = vpshufd_avx(auVar39,0x55);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            iVar69 = auVar39._0_4_;
          }
          pTVar12 = (this_01->grads).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)pTVar12[uVar37].d.nd;
          if (uVar36 != 0) {
            auVar50 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar51 = vmovdqa64_avx512f(auVar47);
            do {
              auVar52 = vmovdqa64_avx512f(auVar51);
              auVar51 = vpbroadcastq_avx512f();
              auVar54 = vporq_avx512f(auVar51,auVar48);
              auVar51 = vporq_avx512f(auVar51,auVar49);
              uVar19 = vpcmpuq_avx512f(auVar51,auVar50,2);
              bVar15 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar54,auVar50,2);
              bVar22 = (byte)uVar19;
              uVar38 = CONCAT11(bVar22,bVar15);
              auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar12[uVar37].d.d + uVar27));
              auVar57._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar51._4_4_;
              auVar57._0_4_ = (uint)(bVar15 & 1) * auVar51._0_4_;
              auVar57._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar51._8_4_;
              auVar57._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar51._12_4_;
              auVar57._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar51._16_4_;
              auVar57._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar51._20_4_;
              auVar57._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar51._24_4_;
              auVar57._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar51._28_4_;
              auVar57._32_4_ = (uint)(bVar22 & 1) * auVar51._32_4_;
              auVar57._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar51._36_4_;
              auVar57._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar51._40_4_;
              auVar57._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar51._44_4_;
              auVar57._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar51._48_4_;
              auVar57._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar51._52_4_;
              auVar57._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar51._56_4_;
              auVar57._60_4_ = (uint)(bVar22 >> 7) * auVar51._60_4_;
              auVar51 = vpmulld_avx512f(auVar57,auVar52);
              uVar27 = uVar27 + 0x10;
            } while ((uVar36 + 0xf & 0x1fffffff0) != uVar27);
            auVar50 = vmovdqa32_avx512f(auVar51);
            auVar58._0_4_ =
                 (uint)(bVar15 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar52._0_4_;
            bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar58._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar52._4_4_;
            bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar58._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar52._8_4_;
            bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
            auVar58._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar52._12_4_;
            bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
            auVar58._16_4_ = (uint)bVar14 * auVar50._16_4_ | (uint)!bVar14 * auVar52._16_4_;
            bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
            auVar58._20_4_ = (uint)bVar14 * auVar50._20_4_ | (uint)!bVar14 * auVar52._20_4_;
            bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
            auVar58._24_4_ = (uint)bVar14 * auVar50._24_4_ | (uint)!bVar14 * auVar52._24_4_;
            bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
            auVar58._28_4_ = (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * auVar52._28_4_;
            auVar58._32_4_ =
                 (uint)(bVar22 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar52._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar58._36_4_ = (uint)bVar14 * auVar50._36_4_ | (uint)!bVar14 * auVar52._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar58._40_4_ = (uint)bVar14 * auVar50._40_4_ | (uint)!bVar14 * auVar52._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar58._44_4_ = (uint)bVar14 * auVar50._44_4_ | (uint)!bVar14 * auVar52._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar58._48_4_ = (uint)bVar14 * auVar50._48_4_ | (uint)!bVar14 * auVar52._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar58._52_4_ = (uint)bVar14 * auVar50._52_4_ | (uint)!bVar14 * auVar52._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar58._56_4_ = (uint)bVar14 * auVar50._56_4_ | (uint)!bVar14 * auVar52._56_4_;
            auVar58._60_4_ =
                 (uint)(bVar22 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar52._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar58,1);
            auVar50 = vpmulld_avx512f(auVar58,ZEXT3264(auVar41));
            auVar39 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
            auVar40 = vpshufd_avx(auVar39,0xee);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            auVar40 = vpshufd_avx(auVar39,0x55);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            iVar70 = auVar39._0_4_;
          }
          lVar28 = *(long *)&pSVar10[local_110].h.
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                   uVar37 * 0x48;
          if ((ulong)*(uint *)(lVar28 + 0x1c) == 0) {
            iVar71 = 1;
          }
          else {
            auVar50 = vpbroadcastq_avx512f();
            uVar36 = 0;
            auVar51 = vmovdqa64_avx512f(auVar47);
            do {
              auVar52 = vmovdqa64_avx512f(auVar51);
              auVar51 = vpbroadcastq_avx512f();
              auVar54 = vporq_avx512f(auVar51,auVar48);
              auVar51 = vporq_avx512f(auVar51,auVar49);
              uVar19 = vpcmpuq_avx512f(auVar51,auVar50,2);
              bVar15 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar54,auVar50,2);
              bVar22 = (byte)uVar19;
              uVar38 = CONCAT11(bVar22,bVar15);
              auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar28 + uVar36 * 4));
              auVar59._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar51._4_4_;
              auVar59._0_4_ = (uint)(bVar15 & 1) * auVar51._0_4_;
              auVar59._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar51._8_4_;
              auVar59._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar51._12_4_;
              auVar59._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar51._16_4_;
              auVar59._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar51._20_4_;
              auVar59._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar51._24_4_;
              auVar59._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar51._28_4_;
              auVar59._32_4_ = (uint)(bVar22 & 1) * auVar51._32_4_;
              auVar59._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar51._36_4_;
              auVar59._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar51._40_4_;
              auVar59._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar51._44_4_;
              auVar59._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar51._48_4_;
              auVar59._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar51._52_4_;
              auVar59._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar51._56_4_;
              auVar59._60_4_ = (uint)(bVar22 >> 7) * auVar51._60_4_;
              auVar51 = vpmulld_avx512f(auVar59,auVar52);
              uVar36 = uVar36 + 0x10;
            } while (((ulong)*(uint *)(lVar28 + 0x1c) + 0xf & 0x1fffffff0) != uVar36);
            auVar50 = vmovdqa32_avx512f(auVar51);
            auVar60._0_4_ =
                 (uint)(bVar15 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar52._0_4_;
            bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar60._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar52._4_4_;
            bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar60._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar52._8_4_;
            bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
            auVar60._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar52._12_4_;
            bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
            auVar60._16_4_ = (uint)bVar14 * auVar50._16_4_ | (uint)!bVar14 * auVar52._16_4_;
            bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
            auVar60._20_4_ = (uint)bVar14 * auVar50._20_4_ | (uint)!bVar14 * auVar52._20_4_;
            bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
            auVar60._24_4_ = (uint)bVar14 * auVar50._24_4_ | (uint)!bVar14 * auVar52._24_4_;
            bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
            auVar60._28_4_ = (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * auVar52._28_4_;
            auVar60._32_4_ =
                 (uint)(bVar22 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar52._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar60._36_4_ = (uint)bVar14 * auVar50._36_4_ | (uint)!bVar14 * auVar52._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar60._40_4_ = (uint)bVar14 * auVar50._40_4_ | (uint)!bVar14 * auVar52._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar60._44_4_ = (uint)bVar14 * auVar50._44_4_ | (uint)!bVar14 * auVar52._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar60._48_4_ = (uint)bVar14 * auVar50._48_4_ | (uint)!bVar14 * auVar52._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar60._52_4_ = (uint)bVar14 * auVar50._52_4_ | (uint)!bVar14 * auVar52._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar60._56_4_ = (uint)bVar14 * auVar50._56_4_ | (uint)!bVar14 * auVar52._56_4_;
            auVar60._60_4_ =
                 (uint)(bVar22 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar52._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar60,1);
            auVar50 = vpmulld_avx512f(auVar60,ZEXT3264(auVar41));
            auVar39 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
            auVar40 = vpshufd_avx(auVar39,0xee);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            auVar40 = vpshufd_avx(auVar39,0x55);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            iVar71 = auVar39._0_4_;
          }
          uVar29 = iVar70 * pTVar12[uVar37].d.bd;
          uVar30 = iVar71 * *(int *)(lVar28 + 0x20);
          uVar36 = (ulong)uVar30;
          if (uVar30 != uVar29) goto LAB_0022b55b;
          uVar27 = *(ulong *)(lVar28 + 0x28);
          uVar34 = uVar36;
          if (((uVar27 & 3) == 0) &&
             (uVar34 = (ulong)(-((uint)(uVar27 >> 2) & 0x3fffffff) & 0xf), uVar36 <= uVar34)) {
            uVar34 = uVar36;
          }
          pfVar6 = pTVar11[uVar37].v;
          uVar30 = iVar69 * pTVar11[uVar37].d.bd;
          rVar1 = (this->super_Trainer).lambda;
          pfVar7 = pTVar12[uVar37].v;
          uVar33 = uVar36 - uVar34;
          uVar32 = uVar33 + 0xf;
          if (-1 < (long)uVar33) {
            uVar32 = uVar33;
          }
          if (uVar34 != 0) {
            uVar25 = 0;
            do {
              auVar39 = vfmadd213ss_fma(ZEXT416((uint)(fVar17 * pfVar7[uVar25])),
                                        ZEXT416((uint)(fVar17 * pfVar7[uVar25])),
                                        ZEXT416(*(uint *)(uVar27 + uVar25 * 4)));
              *(int *)(uVar27 + uVar25 * 4) = auVar39._0_4_;
              uVar25 = uVar25 + 1;
            } while (uVar34 != uVar25);
          }
          uVar32 = (uVar32 & 0xfffffffffffffff0) + uVar34;
          if (0xf < (long)uVar33) {
            do {
              auVar50 = vmulps_avx512f(*(undefined1 (*) [64])(pfVar7 + uVar34),
                                       *(undefined1 (*) [64])(pfVar7 + uVar34));
              auVar50 = vfmadd213ps_avx512f(auVar50,local_b8,
                                            *(undefined1 (*) [64])(uVar27 + uVar34 * 4));
              *(undefined1 (*) [64])(uVar27 + uVar34 * 4) = auVar50;
              uVar34 = uVar34 + 0x10;
            } while ((long)uVar34 < (long)uVar32);
          }
          if ((long)uVar32 < (long)uVar36) {
            do {
              auVar39 = vfmadd213ss_fma(ZEXT416((uint)(fVar17 * pfVar7[uVar32])),
                                        ZEXT416((uint)(fVar17 * pfVar7[uVar32])),
                                        ZEXT416(*(uint *)(uVar27 + uVar32 * 4)));
              *(int *)(uVar27 + uVar32 * 4) = auVar39._0_4_;
              uVar32 = uVar32 + 1;
            } while (uVar36 != uVar32);
          }
          lVar13 = *(long *)(lVar28 + 0x28);
          if ((ulong)*(uint *)(lVar28 + 0x1c) == 0) {
            iVar69 = 1;
          }
          else {
            auVar50 = vpbroadcastq_avx512f();
            uVar36 = 0;
            auVar51 = vmovdqa64_avx512f(auVar47);
            do {
              auVar52 = vmovdqa64_avx512f(auVar51);
              auVar51 = vpbroadcastq_avx512f();
              auVar54 = vporq_avx512f(auVar51,auVar48);
              auVar51 = vporq_avx512f(auVar51,auVar49);
              uVar19 = vpcmpuq_avx512f(auVar51,auVar50,2);
              bVar15 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar54,auVar50,2);
              bVar22 = (byte)uVar19;
              uVar38 = CONCAT11(bVar22,bVar15);
              auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])(lVar28 + uVar36 * 4));
              auVar61._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar51._4_4_;
              auVar61._0_4_ = (uint)(bVar15 & 1) * auVar51._0_4_;
              auVar61._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar51._8_4_;
              auVar61._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar51._12_4_;
              auVar61._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar51._16_4_;
              auVar61._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar51._20_4_;
              auVar61._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar51._24_4_;
              auVar61._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar51._28_4_;
              auVar61._32_4_ = (uint)(bVar22 & 1) * auVar51._32_4_;
              auVar61._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar51._36_4_;
              auVar61._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar51._40_4_;
              auVar61._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar51._44_4_;
              auVar61._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar51._48_4_;
              auVar61._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar51._52_4_;
              auVar61._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar51._56_4_;
              auVar61._60_4_ = (uint)(bVar22 >> 7) * auVar51._60_4_;
              auVar51 = vpmulld_avx512f(auVar61,auVar52);
              uVar36 = uVar36 + 0x10;
            } while (((ulong)*(uint *)(lVar28 + 0x1c) + 0xf & 0x1fffffff0) != uVar36);
            auVar50 = vmovdqa32_avx512f(auVar51);
            auVar62._0_4_ =
                 (uint)(bVar15 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar52._0_4_;
            bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar52._4_4_;
            bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar52._8_4_;
            bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar52._12_4_;
            bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar14 * auVar50._16_4_ | (uint)!bVar14 * auVar52._16_4_;
            bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar14 * auVar50._20_4_ | (uint)!bVar14 * auVar52._20_4_;
            bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar14 * auVar50._24_4_ | (uint)!bVar14 * auVar52._24_4_;
            bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
            auVar62._28_4_ = (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * auVar52._28_4_;
            auVar62._32_4_ =
                 (uint)(bVar22 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar52._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar62._36_4_ = (uint)bVar14 * auVar50._36_4_ | (uint)!bVar14 * auVar52._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar62._40_4_ = (uint)bVar14 * auVar50._40_4_ | (uint)!bVar14 * auVar52._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar62._44_4_ = (uint)bVar14 * auVar50._44_4_ | (uint)!bVar14 * auVar52._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar62._48_4_ = (uint)bVar14 * auVar50._48_4_ | (uint)!bVar14 * auVar52._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar62._52_4_ = (uint)bVar14 * auVar50._52_4_ | (uint)!bVar14 * auVar52._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar62._56_4_ = (uint)bVar14 * auVar50._56_4_ | (uint)!bVar14 * auVar52._56_4_;
            auVar62._60_4_ =
                 (uint)(bVar22 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar52._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar62,1);
            auVar50 = vpmulld_avx512f(auVar62,ZEXT3264(auVar41));
            auVar39 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
            auVar40 = vpshufd_avx(auVar39,0xee);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            auVar40 = vpshufd_avx(auVar39,0x55);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            iVar69 = auVar39._0_4_;
          }
          uVar31 = iVar69 * *(int *)(lVar28 + 0x20);
          if (uVar29 != uVar31) goto LAB_0022b544;
          if (uVar31 != uVar30) goto LAB_0022b57d;
          pTVar11 = (this_01->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar36 = (ulong)pTVar11[uVar37].d.nd;
          if (uVar36 == 0) {
            iVar69 = 1;
          }
          else {
            auVar50 = vpbroadcastq_avx512f();
            uVar27 = 0;
            auVar51 = vmovdqa64_avx512f(auVar47);
            do {
              auVar52 = vmovdqa64_avx512f(auVar51);
              auVar51 = vpbroadcastq_avx512f();
              auVar54 = vporq_avx512f(auVar51,auVar48);
              auVar51 = vporq_avx512f(auVar51,auVar49);
              uVar19 = vpcmpuq_avx512f(auVar51,auVar50,2);
              bVar15 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar54,auVar50,2);
              bVar22 = (byte)uVar19;
              uVar38 = CONCAT11(bVar22,bVar15);
              auVar51 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pTVar11[uVar37].d.d + uVar27));
              auVar63._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar51._4_4_;
              auVar63._0_4_ = (uint)(bVar15 & 1) * auVar51._0_4_;
              auVar63._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar51._8_4_;
              auVar63._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar51._12_4_;
              auVar63._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar51._16_4_;
              auVar63._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar51._20_4_;
              auVar63._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar51._24_4_;
              auVar63._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar51._28_4_;
              auVar63._32_4_ = (uint)(bVar22 & 1) * auVar51._32_4_;
              auVar63._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar51._36_4_;
              auVar63._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar51._40_4_;
              auVar63._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar51._44_4_;
              auVar63._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar51._48_4_;
              auVar63._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar51._52_4_;
              auVar63._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar51._56_4_;
              auVar63._60_4_ = (uint)(bVar22 >> 7) * auVar51._60_4_;
              auVar51 = vpmulld_avx512f(auVar63,auVar52);
              uVar27 = uVar27 + 0x10;
            } while ((uVar36 + 0xf & 0x1fffffff0) != uVar27);
            auVar50 = vmovdqa32_avx512f(auVar51);
            auVar64._0_4_ =
                 (uint)(bVar15 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar52._0_4_;
            bVar14 = (bool)((byte)(uVar38 >> 1) & 1);
            auVar64._4_4_ = (uint)bVar14 * auVar50._4_4_ | (uint)!bVar14 * auVar52._4_4_;
            bVar14 = (bool)((byte)(uVar38 >> 2) & 1);
            auVar64._8_4_ = (uint)bVar14 * auVar50._8_4_ | (uint)!bVar14 * auVar52._8_4_;
            bVar14 = (bool)((byte)(uVar38 >> 3) & 1);
            auVar64._12_4_ = (uint)bVar14 * auVar50._12_4_ | (uint)!bVar14 * auVar52._12_4_;
            bVar14 = (bool)((byte)(uVar38 >> 4) & 1);
            auVar64._16_4_ = (uint)bVar14 * auVar50._16_4_ | (uint)!bVar14 * auVar52._16_4_;
            bVar14 = (bool)((byte)(uVar38 >> 5) & 1);
            auVar64._20_4_ = (uint)bVar14 * auVar50._20_4_ | (uint)!bVar14 * auVar52._20_4_;
            bVar14 = (bool)((byte)(uVar38 >> 6) & 1);
            auVar64._24_4_ = (uint)bVar14 * auVar50._24_4_ | (uint)!bVar14 * auVar52._24_4_;
            bVar14 = (bool)((byte)(uVar38 >> 7) & 1);
            auVar64._28_4_ = (uint)bVar14 * auVar50._28_4_ | (uint)!bVar14 * auVar52._28_4_;
            auVar64._32_4_ =
                 (uint)(bVar22 & 1) * auVar50._32_4_ | (uint)!(bool)(bVar22 & 1) * auVar52._32_4_;
            bVar14 = (bool)(bVar22 >> 1 & 1);
            auVar64._36_4_ = (uint)bVar14 * auVar50._36_4_ | (uint)!bVar14 * auVar52._36_4_;
            bVar14 = (bool)(bVar22 >> 2 & 1);
            auVar64._40_4_ = (uint)bVar14 * auVar50._40_4_ | (uint)!bVar14 * auVar52._40_4_;
            bVar14 = (bool)(bVar22 >> 3 & 1);
            auVar64._44_4_ = (uint)bVar14 * auVar50._44_4_ | (uint)!bVar14 * auVar52._44_4_;
            bVar14 = (bool)(bVar22 >> 4 & 1);
            auVar64._48_4_ = (uint)bVar14 * auVar50._48_4_ | (uint)!bVar14 * auVar52._48_4_;
            bVar14 = (bool)(bVar22 >> 5 & 1);
            auVar64._52_4_ = (uint)bVar14 * auVar50._52_4_ | (uint)!bVar14 * auVar52._52_4_;
            bVar14 = (bool)(bVar22 >> 6 & 1);
            auVar64._56_4_ = (uint)bVar14 * auVar50._56_4_ | (uint)!bVar14 * auVar52._56_4_;
            auVar64._60_4_ =
                 (uint)(bVar22 >> 7) * auVar50._60_4_ | (uint)!(bool)(bVar22 >> 7) * auVar52._60_4_;
            auVar41 = vextracti64x4_avx512f(auVar64,1);
            auVar50 = vpmulld_avx512f(auVar64,ZEXT3264(auVar41));
            auVar39 = vpmulld_avx(auVar50._0_16_,auVar50._16_16_);
            auVar40 = vpshufd_avx(auVar39,0xee);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            auVar40 = vpshufd_avx(auVar39,0x55);
            auVar39 = vpmulld_avx(auVar39,auVar40);
            iVar69 = auVar39._0_4_;
          }
          uVar29 = iVar69 * pTVar11[uVar37].d.bd;
          uVar36 = (ulong)uVar29;
          if (uVar29 != uVar30) goto LAB_0022b52d;
          pfVar8 = pTVar11[uVar37].v;
          uVar37 = uVar36;
          if ((((ulong)pfVar8 & 3) == 0) &&
             (uVar37 = (ulong)(-((uint)((ulong)pfVar8 >> 2) & 0x3fffffff) & 0xf), uVar36 <= uVar37))
          {
            uVar37 = uVar36;
          }
          fVar2 = this->epsilon;
          uVar34 = uVar36 - uVar37;
          uVar27 = uVar34 + 0xf;
          if (-1 < (long)uVar34) {
            uVar27 = uVar34;
          }
          fVar18 = fVar17 * -(this->super_Trainer).eta;
          if (uVar37 != 0) {
            uVar32 = 0;
            do {
              fVar16 = fVar2 + *(float *)(lVar13 + uVar32 * 4);
              auVar39 = vrsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
              auVar40 = vfmadd213ss_fma(ZEXT416((uint)(fVar16 * auVar39._0_4_)),auVar39,
                                        SUB6416(ZEXT464(0xc0400000),0));
              auVar72 = vfnmadd213ss_fma(ZEXT416((uint)pfVar6[uVar32]),ZEXT416((uint)rVar1),
                                         ZEXT416((uint)pfVar8[uVar32]));
              auVar39 = vfmadd231ss_fma(auVar72,ZEXT416((uint)(auVar39._0_4_ * -0.5 * auVar40._0_4_)
                                                       ),ZEXT416((uint)(fVar18 * pfVar7[uVar32])));
              pfVar8[uVar32] = auVar39._0_4_;
              uVar32 = uVar32 + 1;
            } while (uVar37 != uVar32);
          }
          uVar27 = (uVar27 & 0xfffffffffffffff0) + uVar37;
          if (0xf < (long)uVar34) {
            auVar50 = vbroadcastss_avx512f(ZEXT416((uint)fVar2));
            auVar51 = vbroadcastss_avx512f(ZEXT416((uint)fVar18));
            auVar72._0_4_ = -rVar1;
            auVar72._4_4_ = 0x80000000;
            auVar72._8_4_ = 0x80000000;
            auVar72._12_4_ = 0x80000000;
            auVar52 = vbroadcastss_avx512f(auVar72);
            do {
              auVar54 = vaddps_avx512f(auVar50,*(undefined1 (*) [64])(lVar13 + uVar37 * 4));
              auVar65 = vmulps_avx512f(auVar54,auVar42);
              uVar20 = vptestnmd_avx512f(auVar54,auVar43);
              auVar66 = vpaddd_avx512f(auVar54,auVar44);
              uVar19 = vpcmpud_avx512f(auVar66,auVar45,1);
              auVar66 = vrsqrt14ps_avx512f(auVar54);
              auVar67 = vmulps_avx512f(auVar66,auVar66);
              auVar65 = vfmadd213ps_avx512f(auVar67,auVar65,auVar46);
              auVar54 = vmulps_avx512f(auVar54,auVar66);
              uVar38 = ~((ushort)uVar20 | (ushort)uVar19);
              auVar54 = vmulps_avx512f(auVar54,auVar65);
              auVar68._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar54._4_4_;
              auVar68._0_4_ = (uint)((byte)uVar38 & 1) * auVar54._0_4_;
              auVar68._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar54._8_4_;
              auVar68._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar54._12_4_;
              auVar68._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar54._16_4_;
              auVar68._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar54._20_4_;
              auVar68._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar54._24_4_;
              auVar68._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar54._28_4_;
              bVar15 = (byte)(uVar38 >> 8);
              auVar68._32_4_ = (uint)(bVar15 & 1) * auVar54._32_4_;
              auVar68._36_4_ = (uint)(bVar15 >> 1 & 1) * auVar54._36_4_;
              auVar68._40_4_ = (uint)(bVar15 >> 2 & 1) * auVar54._40_4_;
              auVar68._44_4_ = (uint)(bVar15 >> 3 & 1) * auVar54._44_4_;
              auVar68._48_4_ = (uint)(bVar15 >> 4 & 1) * auVar54._48_4_;
              auVar68._52_4_ = (uint)(bVar15 >> 5 & 1) * auVar54._52_4_;
              auVar68._56_4_ = (uint)(bVar15 >> 6 & 1) * auVar54._56_4_;
              auVar68._60_4_ = (uint)(bVar15 >> 7) * auVar54._60_4_;
              auVar54 = vrcp14ps_avx512f(auVar68);
              auVar65 = vmulps_avx512f(auVar51,*(undefined1 (*) [64])(pfVar7 + uVar37));
              auVar66 = vmulps_avx512f(auVar65,auVar54);
              auVar65 = vfmsub213ps_avx512f(auVar68,auVar66,auVar65);
              auVar54 = vfnmadd213ps_avx512f(auVar65,auVar54,auVar66);
              auVar65 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar6 + uVar37),auVar52,
                                            *(undefined1 (*) [64])(pfVar8 + uVar37));
              auVar54 = vaddps_avx512f(auVar65,auVar54);
              *(undefined1 (*) [64])(pfVar8 + uVar37) = auVar54;
              uVar37 = uVar37 + 0x10;
            } while ((long)uVar37 < (long)uVar27);
          }
          if ((long)uVar27 < (long)uVar36) {
            do {
              fVar16 = fVar2 + *(float *)(lVar13 + uVar27 * 4);
              auVar39 = vrsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
              auVar40 = vfmadd213ss_fma(ZEXT416((uint)(fVar16 * auVar39._0_4_)),auVar39,
                                        SUB6416(ZEXT464(0xc0400000),0));
              auVar72 = vfnmadd213ss_fma(ZEXT416((uint)pfVar6[uVar27]),ZEXT416((uint)rVar1),
                                         ZEXT416((uint)pfVar8[uVar27]));
              auVar39 = vfmadd231ss_fma(auVar72,ZEXT416((uint)(auVar39._0_4_ * -0.5 * auVar40._0_4_)
                                                       ),ZEXT416((uint)(fVar18 * pfVar7[uVar27])));
              pfVar8[uVar27] = auVar39._0_4_;
              uVar27 = uVar27 + 1;
            } while (uVar36 != uVar27);
          }
          p_Var23 = p_Var23->_M_nxt;
        } while (p_Var23 != (_Hash_node_base *)0x0);
      }
      local_110 = (ulong)((int)local_110 + 1);
      LookupParameters::clear(this_01);
      auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar47 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar46 = vbroadcastss_avx512f(ZEXT416(0x3fc00000));
      auVar45 = vpbroadcastd_avx512f(ZEXT416(0x7fffff));
      auVar44 = vpternlogd_avx512f(auVar44,auVar44,auVar44,0xff);
      auVar43 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar42 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      ppLVar24 = ppLVar24 + 1;
    } while (ppLVar24 != (pointer)local_78._0_8_);
  }
  (this->super_Trainer).updates = (this->super_Trainer).updates + 1.0;
  return;
LAB_0022b55b:
  pcVar26 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
  ;
  goto LAB_0022b570;
LAB_0022b544:
  pcVar26 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>]"
  ;
  goto LAB_0022b592;
LAB_0022b57d:
  pcVar26 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<float>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, Rhs ..." /* TRUNCATED STRING LITERAL */
  ;
LAB_0022b592:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar26);
LAB_0022b52d:
  pcVar26 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>, const Eigen::MatrixWrapper<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::ArrayWrapper<Eigen::Map<Eigen::Matrix<float, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Array<float, -1, 1>>>>>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
  ;
LAB_0022b570:
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar26);
}

Assistant:

void AdagradTrainer::update(real scale) {
  unsigned pi;
  if (!shadow_params_allocated) {
    vp = AllocateShadowParameters(*model);
    vlp = AllocateShadowLookupParameters(*model);
    shadow_params_allocated = true;
  }

  pi = 0;
  const float gscale = clip_gradients();
  for (auto p : model->parameters_list()) {
    Tensor& v = vp[pi++].h;
    auto reg = p->values.vec() * lambda;
    auto g = scale * gscale * p->g.vec();
    auto g2 = g.cwiseProduct(g);
    v.vec() += g2;
    auto delta = -eta * g.cwiseQuotient((v.vec().array() + epsilon).matrix().cwiseSqrt());
    p->values.vec() += delta - reg;
    p->clear();
  }

  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vx = vlp[pi++].h;
    for (auto i : p->non_zero_grads) {
      Tensor& v = vx[i];
      auto reg = p->values[i].vec() * lambda;
      auto g = scale * gscale * p->grads[i].vec();
      auto g2 = g.cwiseProduct(g);
      v.vec() += g2;
      auto delta = -eta * g.cwiseQuotient((v.vec().array() + epsilon).matrix().cwiseSqrt());
      p->values[i].vec() += delta - reg;
    }
    p->clear();
  }

  ++updates;
}